

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

void __thiscall
chrono::ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed>::CreateJacobianMatrices
          (ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *this)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvars;
  long *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_48;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_30;
  
  if (*(long *)&this->field_0x38 == 0) {
    puVar2 = (undefined8 *)operator_new(0x80);
    *puVar2 = std::__cxx11::string::~string;
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
    puVar2[4] = 0;
    puVar2[5] = 0;
    puVar2[6] = 0;
    puVar2[7] = 0;
    puVar2[8] = 0;
    puVar2[8] = 0;
    puVar2[9] = 0;
    puVar2[10] = 0;
    puVar2[0xb] = 0;
    puVar2[0xc] = 0;
    puVar2[0xd] = 0;
    puVar2[0xe] = 0;
    puVar2[0xf] = 0;
    *(undefined8 **)&this->field_0x38 = puVar2;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._0_16_ = ZEXT416(0) << 0x40;
    std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChLoadableU,void>
              ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               &(this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
                super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
    (**(code **)(*local_58 + 0x60))(local_58,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    uVar1 = *(undefined8 *)&this->field_0x38;
    std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
              ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_30,
               (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_48);
    chrono::ChLoadJacobians::SetVariables(uVar1,&local_30);
    std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
              (&local_30);
    std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
              (&local_48);
  }
  return;
}

Assistant:

inline void ChLoad<Tloader>::CreateJacobianMatrices() {
    if (!this->jacobians) {
        // create jacobian structure
        this->jacobians = new ChLoadJacobians;
        // set variables forsparse KRM block
        std::vector<ChVariables*> mvars;
        loader.GetLoadable()->LoadableGetVariables(mvars);
        this->jacobians->SetVariables(mvars);
    }
}